

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,RawStringStmt *stmt)

{
  undefined1 *puVar1;
  pointer pbVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  pointer pbVar4;
  string_view sVar5;
  undefined8 uStack_38;
  
  pbVar4 = (stmt->stmts_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (stmt->stmts_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar4 != pbVar2) {
    uStack_38 = in_RAX;
    do {
      sVar5 = indent(this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&(this->stream_).super_stringstream.field_0x10,sVar5._M_str,
                          sVar5._M_len);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length);
      puVar1 = &(this->stream_).super_stringstream.field_0x90;
      *(long *)puVar1 = *(long *)puVar1 + 1;
      uStack_38 = CONCAT17(10,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_38 + 7),1);
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != pbVar2);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(RawStringStmt* stmt) {
    auto const& stmts = stmt->stmts();
    for (auto const& line : stmts) {
        // we assume it's already been processed with new lines
        stream_ << indent() << line << stream_.endl();
    }
}